

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O3

void Eigen::internal::
     general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::
     run(long size,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,ResScalar *res
        ,long resStride,ResScalar *alpha)

{
  double *pdVar1;
  ResScalar alpha_00;
  long lVar2;
  undefined1 *__ptr;
  double *blockA;
  double *pdVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong __size;
  long lVar6;
  long lVar7;
  long lVar8;
  double dStack_b8;
  long local_b0;
  long nc;
  long local_a0;
  double *local_98;
  long local_90;
  double *local_88;
  long local_80;
  long kc;
  long local_70;
  ulong local_68;
  ulong local_60;
  long mc;
  ulong local_50;
  undefined1 *local_48;
  double *local_40;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_34;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> local_33;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> local_31 [5];
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> sybb;
  
  pdVar3 = &dStack_b8;
  local_b0 = size;
  local_a0 = rhsStride;
  local_98 = _rhs;
  local_88 = _lhs;
  local_80 = depth;
  kc = lhsStride;
  local_60 = size;
  computeProductBlockingSizes<double,double,1,long>(&local_80,(long *)&local_60,&local_b0);
  lVar6 = local_80;
  if (4 < (long)local_60) {
    local_60 = local_60 & 0x7ffffffffffffffc;
  }
  if (local_60 * local_80 >> 0x3d != 0) {
LAB_0010c9fb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __size = local_60 * local_80 * 8;
  if (__size < 0x20001) {
    local_40 = (double *)((long)&dStack_b8 - (__size + 0xf & 0xfffffffffffffff0));
    pdVar3 = local_40;
  }
  else {
    local_40 = (double *)malloc(__size);
    if (local_40 == (double *)0x0) goto LAB_0010c9fb;
  }
  uVar5 = (size + 8) * lVar6;
  if (0x1fffffffffffffff < uVar5) {
    pdVar3[-1] = 5.43594244639894e-318;
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    pdVar3[-1] = 5.43612031003144e-318;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_50 = __size;
  local_68 = uVar5;
  if (uVar5 < 0x4001) {
    pdVar3 = (double *)((long)pdVar3 - (uVar5 * 8 + 0xf & 0xfffffffffffffff0));
    local_48 = (undefined1 *)pdVar3;
  }
  else {
    pdVar3[-1] = 5.43349188079557e-318;
    local_48 = (undefined1 *)malloc(uVar5 * 8);
    if (local_48 == (undefined1 *)0x0) {
      pdVar3[-1] = 5.43639698679311e-318;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_delete;
      pdVar3[-1] = (double)&LAB_0010ca57;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if (0 < depth) {
    mc = (long)(local_48 + lVar6 * 0x40);
    lVar7 = 0;
    local_90 = depth;
    do {
      lVar2 = local_a0;
      lVar8 = lVar6 + lVar7;
      if (local_90 <= lVar6 + lVar7) {
        lVar8 = local_90;
      }
      lVar8 = lVar8 - lVar7;
      local_70 = lVar7;
      pdVar1 = local_98 + lVar7 * local_a0;
      *(undefined8 *)((long)pdVar3 + -0x10) = 0;
      *(undefined8 *)((long)pdVar3 + -8) = 0;
      lVar6 = mc;
      *(undefined8 *)((long)pdVar3 + -0x18) = 0x10c85a;
      gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                (&local_33,(double *)lVar6,pdVar1,lVar2,lVar8,size,*(long *)((long)pdVar3 + -0x10),
                 *(long *)((long)pdVar3 + -8));
      if (0 < size) {
        nc = (long)(local_88 + local_70 * kc);
        lVar6 = 0;
        do {
          lVar7 = local_60 + lVar6;
          if (size <= (long)(local_60 + lVar6)) {
            lVar7 = size;
          }
          lVar7 = lVar7 - lVar6;
          pdVar1 = (double *)(nc + lVar6 * 8);
          *(undefined8 *)((long)pdVar3 + -0x10) = 0;
          *(undefined8 *)((long)pdVar3 + -8) = 0;
          blockA = local_40;
          lVar2 = kc;
          *(undefined8 *)((long)pdVar3 + -0x18) = 0x10c8c5;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (&local_34,blockA,pdVar1,lVar2,lVar8,lVar7,*(long *)((long)pdVar3 + -0x10),
                     *(long *)((long)pdVar3 + -8));
          alpha_00 = *alpha;
          *(undefined1 **)((long)pdVar3 + -0x10) = local_48;
          *(undefined8 *)((long)pdVar3 + -0x20) = 0;
          *(undefined8 *)((long)pdVar3 + -0x18) = 0;
          *(undefined8 *)((long)pdVar3 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)((long)pdVar3 + -0x30) = 0xffffffffffffffff;
          *(long *)((long)pdVar3 + -0x38) = lVar6;
          *(long *)((long)pdVar3 + -0x40) = lVar8;
          lVar2 = mc;
          *(undefined8 *)((long)pdVar3 + -0x48) = 0x10c91f;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,res + lVar6,resStride,blockA,(double *)lVar2,lVar7,
                     *(long *)((long)pdVar3 + -0x40),*(long *)((long)pdVar3 + -0x38),alpha_00,
                     *(long *)((long)pdVar3 + -0x30),*(long *)((long)pdVar3 + -0x28),
                     *(long *)((long)pdVar3 + -0x20),*(long *)((long)pdVar3 + -0x18),
                     *(double **)((long)pdVar3 + -0x10));
          pdVar1 = (double *)(mc + lVar6 * lVar8 * 8);
          *(undefined1 **)((long)pdVar3 + -0x10) = local_48;
          *(ResScalar **)((long)pdVar3 + -0x18) = alpha;
          *(long *)((long)pdVar3 + -0x20) = lVar8;
          *(undefined8 *)((long)pdVar3 + -0x28) = 0x10c964;
          tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
                    (local_31,res + lVar6 * resStride + lVar6,resStride,blockA,pdVar1,lVar7,
                     *(long *)((long)pdVar3 + -0x20),*(ResScalar **)((long)pdVar3 + -0x18),
                     *(double **)((long)pdVar3 + -0x10));
          lVar6 = lVar6 + local_60;
        } while (lVar6 < size);
      }
      lVar7 = local_70 + local_80;
      lVar6 = local_80;
    } while (lVar7 < local_90);
  }
  __ptr = local_48;
  if (0x4000 < local_68) {
    *(undefined8 *)((long)pdVar3 + -8) = 0x10c9a9;
    free(__ptr);
  }
  pdVar1 = local_40;
  if (0x20000 < local_50) {
    *(undefined8 *)((long)pdVar3 + -8) = 0x10c9bc;
    free(pdVar1);
  }
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Index size, Index depth,const LhsScalar* _lhs, Index lhsStride,
                                      const RhsScalar* _rhs, Index rhsStride, ResScalar* res, Index resStride, const ResScalar& alpha)
  {
    const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
    const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

    typedef gebp_traits<LhsScalar,RhsScalar> Traits;

    Index kc = depth; // cache block size along the K direction
    Index mc = size;  // cache block size along the M direction
    Index nc = size;  // cache block size along the N direction
    computeProductBlockingSizes<LhsScalar,RhsScalar>(kc, mc, nc);
    // !!! mc must be a multiple of nr:
    if(mc > Traits::nr)
      mc = (mc/Traits::nr)*Traits::nr;

    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    std::size_t sizeB = sizeW + kc*size;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, kc*mc, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, allocatedBlockB, sizeB, 0);
    RhsScalar* blockB = allocatedBlockB + sizeW;
    
    gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
    gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
    gebp_kernel <LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;
    tribb_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs, UpLo> sybb;

    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // note that the actual rhs is the transpose/adjoint of mat
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, size);

      for(Index i2=0; i2<size; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,size)-i2;

        pack_lhs(blockA, &lhs(i2, k2), lhsStride, actual_kc, actual_mc);

        // the selected actual_mc * size panel of res is split into three different part:
        //  1 - before the diagonal => processed with gebp or skipped
        //  2 - the actual_mc x actual_mc symmetric block => processed with a special kernel
        //  3 - after the diagonal => processed with gebp or skipped
        if (UpLo==Lower)
          gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, (std::min)(size,i2), alpha,
               -1, -1, 0, 0, allocatedBlockB);

        sybb(res+resStride*i2 + i2, resStride, blockA, blockB + actual_kc*i2, actual_mc, actual_kc, alpha, allocatedBlockB);

        if (UpLo==Upper)
        {
          Index j2 = i2+actual_mc;
          gebp(res+resStride*j2+i2, resStride, blockA, blockB+actual_kc*j2, actual_mc, actual_kc, (std::max)(Index(0), size-j2), alpha,
               -1, -1, 0, 0, allocatedBlockB);
        }
      }
    }
  }